

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O0

void ResetProfilingData(void)

{
  glcycle_t::Reset(&All);
  glcycle_t::Clock(&All);
  glcycle_t::Reset(&Bsp);
  glcycle_t::Reset(&PortalAll);
  glcycle_t::Reset(&RenderAll);
  glcycle_t::Reset(&ProcessAll);
  glcycle_t::Reset(&RenderWall);
  glcycle_t::Reset(&SetupWall);
  glcycle_t::Reset(&ClipWall);
  glcycle_t::Reset(&RenderFlat);
  glcycle_t::Reset(&SetupFlat);
  glcycle_t::Reset(&RenderSprite);
  glcycle_t::Reset(&SetupSprite);
  glcycle_t::Reset(&drawcalls);
  vertexcount = 0;
  flatprimitives = 0;
  flatvertices = 0;
  rendered_portals = 0;
  rendered_decals = 0;
  rendered_sprites = 0;
  rendered_flats = 0;
  rendered_lines = 0;
  render_vertexsplit = 0;
  render_texsplit = 0;
  return;
}

Assistant:

void ResetProfilingData()
{
	All.Reset();
	All.Clock();
	Bsp.Reset();
	PortalAll.Reset();
	RenderAll.Reset();
	ProcessAll.Reset();
	RenderWall.Reset();
	SetupWall.Reset();
	ClipWall.Reset();
	RenderFlat.Reset();
	SetupFlat.Reset();
	RenderSprite.Reset();
	SetupSprite.Reset();
	drawcalls.Reset();

	flatvertices=flatprimitives=vertexcount=0;
	render_texsplit=render_vertexsplit=rendered_lines=rendered_flats=rendered_sprites=rendered_decals=rendered_portals = 0;
}